

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAutoHandle.cxx
# Opt level: O0

void __thiscall auto_async_t::reset(auto_async_t *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  auto_async_t *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->handleMutex);
  auto_handle_base_<uv_async_s>::reset((auto_handle_base_<uv_async_s> *)this);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void auto_async_t::reset()
{
  std::lock_guard<std::mutex> lock(handleMutex);
  auto_handle_base_<uv_async_t>::reset();
}